

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Warn.cpp
# Opt level: O3

void __thiscall
WarnGameCommand::trigger
          (WarnGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  uint __val;
  Server *pSVar1;
  PlayerInfo *pPVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  const_iterator cVar8;
  uint uVar9;
  ulong uVar10;
  uint __len;
  char *in_R9;
  uint uVar11;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  parameters_split;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 uVar12;
  string local_b8;
  uint local_94;
  Server *local_90;
  PlayerInfo *local_88;
  undefined8 local_80;
  char *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  uVar12 = (undefined4)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  jessilib::
  word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char_const*,char_const*>
            (&local_50,(jessilib *)parameters._M_str,
             (char *)((jessilib *)parameters._M_str + parameters._M_len)," \t","",in_R9);
  if (local_50.second._M_len == 0) {
    RenX::Server::sendMessage
              (source,player,0x39,"Error: Too few parameters. Syntax: Warn <Player> <Reason>");
  }
  else {
    lVar5 = RenX::Server::getPlayerByPartName(source,local_50.first._M_len,local_50.first._M_str);
    if (lVar5 != 0) {
      local_78 = local_50.second._M_str;
      local_90 = source;
      puVar6 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
      lVar7 = Jupiter::Config::operator[](lVar5 + 0x1b8,puVar6[1],*puVar6);
      local_b8._M_dataplus._M_p = (pointer)0x1;
      local_b8._M_string_length = 0x10c013;
      cVar8 = std::
              _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                        ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)(lVar7 + 0x28),
                         (basic_string_view<char,_std::char_traits<char>_> *)&local_b8);
      if (cVar8.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur == (__node_type *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = Jupiter_strtoi_s(*(undefined8 *)
                                  ((long)cVar8.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x28),
                                 *(undefined8 *)
                                  ((long)cVar8.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x30),0);
      }
      uVar11 = iVar4 + 1;
      if (iVar4 < pluginInstance.m_maxWarns) {
        local_88 = player;
        puVar6 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
        local_80 = Jupiter::Config::operator[](lVar5 + 0x1b8,puVar6[1],*puVar6);
        __val = -uVar11;
        if (0 < (int)uVar11) {
          __val = uVar11;
        }
        __len = 1;
        if (9 < __val) {
          uVar10 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar9 = (uint)uVar10;
            if (uVar9 < 100) {
              __len = __len - 2;
              goto LAB_0010a380;
            }
            if (uVar9 < 1000) {
              __len = __len - 1;
              goto LAB_0010a380;
            }
            if (uVar9 < 10000) goto LAB_0010a380;
            uVar10 = uVar10 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar9);
          __len = __len + 1;
        }
LAB_0010a380:
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        local_94 = uVar11;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_construct(&local_70,(ulong)(__len + -((int)uVar11 >> 0x1f)),'-');
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_70._M_dataplus._M_p + (uint)-((int)uVar11 >> 0x1f),__len,__val);
        Jupiter::Config::set(local_80,1,"w",&local_70);
        pPVar2 = local_88;
        pSVar1 = local_90;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        string_printf_abi_cxx11_
                  (&local_b8,"You have been warned by %.*s for: %.*s. You have %d warnings.",
                   (pPVar2->name)._M_string_length,(pPVar2->name)._M_dataplus._M_p,
                   local_50.second._M_len,local_78,CONCAT44(uVar12,local_94));
        RenX::Server::sendWarnMessage
                  (pSVar1,lVar5,local_b8._M_string_length,local_b8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        string_printf_abi_cxx11_
                  (&local_b8,"%.*s has been warned; they now have %d warnings.",
                   *(undefined8 *)(lVar5 + 0x10),*(undefined8 *)(lVar5 + 8),(ulong)local_94);
        RenX::Server::sendMessage(pSVar1,pPVar2,local_b8._M_string_length,local_b8._M_dataplus._M_p)
        ;
      }
      else if (pluginInstance.m_warnAction == -1) {
        string_printf_abi_cxx11_(&local_b8,"Warning limit reached (%d warnings)",(ulong)uVar11);
        pSVar1 = local_90;
        RenX::Server::kickPlayer(local_90,lVar5,local_b8._M_string_length,local_b8._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        string_printf_abi_cxx11_
                  (&local_b8,
                   "%.*s has been kicked from the server for exceeding the warning limit (%d warnings)."
                   ,*(undefined8 *)(lVar5 + 0x10),*(undefined8 *)(lVar5 + 8),(ulong)uVar11);
        RenX::Server::sendMessage(pSVar1,player,local_b8._M_string_length,local_b8._M_dataplus._M_p)
        ;
      }
      else {
        string_printf_abi_cxx11_(&local_b8,"Warning limit reached (%d warnings)",(ulong)uVar11);
        pSVar1 = local_90;
        RenX::Server::banPlayer
                  (local_90,lVar5,0x15,"Jupiter Bot/RenX.Warn",local_b8._M_string_length,
                   local_b8._M_dataplus._M_p,(long)pluginInstance.m_warnAction);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        string_printf_abi_cxx11_
                  (&local_b8,
                   "%.*s has been banned from the server for exceeding the warning limit (%d warnings)."
                   ,*(undefined8 *)(lVar5 + 0x10),*(undefined8 *)(lVar5 + 8),(ulong)uVar11);
        RenX::Server::sendMessage(pSVar1,player,local_b8._M_string_length,local_b8._M_dataplus._M_p)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void WarnGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters) {
	auto parameters_split = jessilib::word_split_once_view(std::string_view{parameters}, WHITESPACE_SV);
	if (!parameters_split.second.empty()) {
		std::string_view name = parameters_split.first;
		std::string_view reason = parameters_split.second;

		RenX::PlayerInfo *target = source->getPlayerByPartName(name);
		if (target != nullptr) {
			int warns = target->varData[pluginInstance.getName()].get<int>(WARNS_KEY) + 1;
			if (warns > pluginInstance.m_maxWarns) {
				switch (pluginInstance.m_warnAction)
				{
				case -1:
					source->kickPlayer(*target, string_printf("Warning limit reached (%d warnings)", warns));
					source->sendMessage(*player, string_printf("%.*s has been kicked from the server for exceeding the warning limit (%d warnings).", target->name.size(), target->name.data(), warns));
					break;
				default:
					source->banPlayer(*target, "Jupiter Bot/RenX.Warn"sv, string_printf("Warning limit reached (%d warnings)", warns), std::chrono::seconds(pluginInstance.m_warnAction));
					source->sendMessage(*player, string_printf("%.*s has been banned from the server for exceeding the warning limit (%d warnings).", target->name.size(), target->name.data(), warns));
					break;
				}
			}
			else {
				target->varData[pluginInstance.getName()].set(WARNS_KEY, std::to_string(warns));
				source->sendWarnMessage(*target, string_printf("You have been warned by %.*s for: %.*s. You have %d warnings.", player->name.size(), player->name.data(), reason.size(), reason.data(), warns));
				source->sendMessage(*player, string_printf("%.*s has been warned; they now have %d warnings.", target->name.size(), target->name.data(), warns));
			}
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: Warn <Player> <Reason>"sv);
}